

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O3

Lpk_Res_t * Lpk_DsdAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p,int nShared)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  Kit_DsdNtk_t *pNtk;
  Vec_Int_t *vBSets;
  uint i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uLateArrSupp;
  Lpk_Res_t *pLVar8;
  uint *(*ppTruths) [16];
  char pCofVars [5];
  Kit_DsdNtk_t *pNtks [8];
  char local_7d [5];
  Kit_DsdNtk_t *local_78 [9];
  
  local_78[6] = (Kit_DsdNtk_t *)0x0;
  local_78[7] = (Kit_DsdNtk_t *)0x0;
  local_78[4] = (Kit_DsdNtk_t *)0x0;
  local_78[5] = (Kit_DsdNtk_t *)0x0;
  local_78[2] = (Kit_DsdNtk_t *)0x0;
  local_78[3] = (Kit_DsdNtk_t *)0x0;
  local_78[0] = (Kit_DsdNtk_t *)0x0;
  local_78[1] = (Kit_DsdNtk_t *)0x0;
  if ((*(uint *)&p->field_0x8 & 0xf000) < 0x2001) {
    __assert_fail("p->nLutK >= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d1,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  if (3 < (uint)nShared) {
    __assert_fail("nShared >= 0 && nShared <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d2,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  uVar4 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  if ((-1 << (sbyte)uVar4 ^ p->uSupp) != 0xffffffff) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d3,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  pNtk = Kit_DsdDecomposeExpand((uint *)(p + 1),uVar4);
  local_78[0] = pNtk;
  if (pMan->pPars->fVerbose != 0) {
    iVar3 = Kit_DsdNonDsdSizeMax(pNtk);
    pMan->nBlocks[iVar3] = pMan->nBlocks[iVar3] + 1;
  }
  vBSets = Lpk_ComputeBoundSets(pNtk,*(uint *)&p->field_0x8 >> 0xc & 0xf);
  lVar5 = 0;
  uVar4 = 0;
  do {
    uVar6 = 1 << ((byte)lVar5 & 0x1f);
    if ((p->uSupp >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      if ((int)p->pDelays[lVar5] <= (int)((*(uint *)&p->field_0x8 >> 0x15 & 0x1ff) - 2)) {
        uVar6 = 0;
      }
      uVar4 = uVar4 | uVar6;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  Lpk_FunCompareBoundSets(p,vBSets,0,0xffff,uVar4,&Lpk_DsdAnalize::Res0);
  if (vBSets->pArray != (int *)0x0) {
    free(vBSets->pArray);
  }
  free(vBSets);
  uVar4 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
  if (Lpk_DsdAnalize::Res0.nBSVars == uVar4 - 1 || Lpk_DsdAnalize::Res0.nBSVars == uVar4) {
LAB_00473a08:
    pLVar8 = &Lpk_DsdAnalize::Res0;
    goto LAB_00473bc8;
  }
  if (nShared != 0) {
    puVar1 = pMan->ppTruths[0][0];
    ppTruths = pMan->ppTruths;
    uVar4 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
    uVar7 = (ulong)(uint)(1 << ((char)uVar4 - 5U & 0x1f));
    if (uVar4 < 6) {
      uVar7 = 1;
    }
    do {
      puVar1[uVar7 - 1] = *(uint *)(p->pFanins + uVar7 * 4 + 0xc);
      bVar2 = 1 < uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
    iVar3 = Lpk_DsdAnalizeOne(p,ppTruths,local_78,local_7d,1,&Lpk_DsdAnalize::Res1);
    if (iVar3 != 0) {
      uVar4 = *(uint *)&p->field_0x8;
      uVar6 = uVar4 >> 0xc & 0xf;
      if ((int)uVar6 <= Lpk_DsdAnalize::Res1.nBSVars) {
        __assert_fail("pRes1->nBSVars <= (int)p->nLutK - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                      ,0x1eb,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
      }
      if (Lpk_DsdAnalize::Res1.nBSVars != uVar6 - 1) {
        if (Lpk_DsdAnalize::Res0.nBSVars == uVar6 - 2) goto LAB_00473a08;
        if (Lpk_DsdAnalize::Res1.nBSVars != uVar6 - 2) {
          if (nShared != 1) {
            if (uVar6 < 4) {
LAB_00473b49:
              if (0x4000 < (uVar4 & 0xf000)) {
                pLVar8 = &Lpk_DsdAnalize::Res3;
                iVar3 = Lpk_DsdAnalizeOne(p,ppTruths,local_78,local_7d,3,&Lpk_DsdAnalize::Res3);
                if (iVar3 != 0) {
                  uVar4 = *(uint *)&p->field_0x8 >> 0xc & 0xf;
                  iVar3 = uVar4 - 3;
                  if (iVar3 < Lpk_DsdAnalize::Res3.nBSVars) {
                    __assert_fail("pRes3->nBSVars <= (int)p->nLutK - 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                                  ,0x210,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)")
                    ;
                  }
                  if (Lpk_DsdAnalize::Res3.nBSVars != iVar3) {
                    iVar3 = uVar4 - 4;
                    pLVar8 = &Lpk_DsdAnalize::Res0;
                    if ((Lpk_DsdAnalize::Res0.nBSVars != iVar3) &&
                       (pLVar8 = &Lpk_DsdAnalize::Res1, Lpk_DsdAnalize::Res1.nBSVars != iVar3)) {
                      if (Lpk_DsdAnalize::Res2.nBSVars == iVar3) {
                        pLVar8 = &Lpk_DsdAnalize::Res2;
                      }
                      else {
                        pLVar8 = (Lpk_Res_t *)0x0;
                        if (Lpk_DsdAnalize::Res3.nBSVars == iVar3) {
                          pLVar8 = &Lpk_DsdAnalize::Res3;
                        }
                      }
                    }
                  }
                  goto LAB_00473bc8;
                }
              }
            }
            else {
              pLVar8 = &Lpk_DsdAnalize::Res2;
              iVar3 = Lpk_DsdAnalizeOne(p,ppTruths,local_78,local_7d,2,&Lpk_DsdAnalize::Res2);
              if (iVar3 != 0) {
                uVar4 = *(uint *)&p->field_0x8;
                uVar6 = uVar4 >> 0xc & 0xf;
                iVar3 = uVar6 - 2;
                if (Lpk_DsdAnalize::Res2.nBSVars != iVar3 && iVar3 <= Lpk_DsdAnalize::Res2.nBSVars)
                {
                  __assert_fail("pRes2->nBSVars <= (int)p->nLutK - 2",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkAbcDsd.c"
                                ,0x1fa,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
                }
                if (Lpk_DsdAnalize::Res2.nBSVars == iVar3) goto LAB_00473bc8;
                iVar3 = uVar6 - 3;
                if (Lpk_DsdAnalize::Res0.nBSVars == iVar3) goto LAB_00473a08;
                if (Lpk_DsdAnalize::Res1.nBSVars == iVar3) goto LAB_00473aa8;
                if (Lpk_DsdAnalize::Res2.nBSVars == iVar3) goto LAB_00473bc8;
                if (nShared != 2) goto LAB_00473b49;
              }
            }
          }
          goto LAB_00473bc5;
        }
      }
LAB_00473aa8:
      pLVar8 = &Lpk_DsdAnalize::Res1;
      goto LAB_00473bc8;
    }
  }
LAB_00473bc5:
  pLVar8 = (Lpk_Res_t *)0x0;
LAB_00473bc8:
  lVar5 = 0;
  do {
    if (local_78[lVar5] != (Kit_DsdNtk_t *)0x0) {
      Kit_DsdNtkFree(local_78[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while ((uint)lVar5 >> ((byte)nShared & 0x1f) == 0);
  return pLVar8;
}

Assistant:

Lpk_Res_t * Lpk_DsdAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p, int nShared )
{ 
    static Lpk_Res_t Res0, * pRes0 = &Res0;
    static Lpk_Res_t Res1, * pRes1 = &Res1;
    static Lpk_Res_t Res2, * pRes2 = &Res2;
    static Lpk_Res_t Res3, * pRes3 = &Res3;
    int fUseBackLooking = 1;
    Lpk_Res_t * pRes = NULL;
    Vec_Int_t * vBSets;
    Kit_DsdNtk_t * pNtks[8] = {NULL};
    char pCofVars[5];
    int i;

    assert( p->nLutK >= 3 );
    assert( nShared >= 0 && nShared <= 3 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );

    // try decomposition without cofactoring
    pNtks[0] = Kit_DsdDecomposeExpand( Lpk_FunTruth( p, 0 ), p->nVars );
    if ( pMan->pPars->fVerbose )
        pMan->nBlocks[ Kit_DsdNonDsdSizeMax(pNtks[0]) ]++;
    vBSets = Lpk_ComputeBoundSets( pNtks[0], p->nLutK );
    Lpk_FunCompareBoundSets( p, vBSets, 0, 0xFFFF, Lpk_DsdLateArriving(p), pRes0 );
    Vec_IntFree( vBSets );

    // check the result
    if ( pRes0->nBSVars == (int)p->nLutK )
        { pRes = pRes0; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes0; goto finish; }
    if ( nShared == 0 )
        goto finish;

    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth( p, 0 ), p->nVars );

    // cofactor 1 time
    if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 1, pRes1 ) )
        goto finish;
    assert( pRes1->nBSVars <= (int)p->nLutK - 1 );
    if ( pRes1->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes1; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes0; goto finish; }
    if ( pRes1->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes1; goto finish; }
    if ( nShared == 1 )
        goto finish;

    // cofactor 2 times
    if ( p->nLutK >= 4 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 2, pRes2 ) )
            goto finish;
        assert( pRes2->nBSVars <= (int)p->nLutK - 2 );
        if ( pRes2->nBSVars == (int)p->nLutK - 2 )
            { pRes = pRes2; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes1; goto finish; }
        }
        if ( pRes2->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes2; goto finish; }
        if ( nShared == 2 )
            goto finish;
        assert( nShared == 3 );
    }

    // cofactor 3 times
    if ( p->nLutK >= 5 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 3, pRes3 ) )
            goto finish;
        assert( pRes3->nBSVars <= (int)p->nLutK - 3 );
        if ( pRes3->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes3; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes1; goto finish; }
            if ( pRes2->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes2; goto finish; }
        }
        if ( pRes3->nBSVars == (int)p->nLutK - 4 )
            { pRes = pRes3; goto finish; }
    }

finish:
    // free the networks
    for ( i = 0; i < (1<<nShared); i++ )
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
    // choose the best under these conditions
    return pRes;
}